

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg-traversal.h
# Opt level: O1

int __thiscall
wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::link
          (CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>
           *this,char *__from,char *__to)

{
  pointer *pppBVar1;
  iterator iVar2;
  undefined8 in_RAX;
  BasicBlock *extraout_RAX;
  BasicBlock *local_18;
  BasicBlock *from_local;
  BasicBlock *to_local;
  
  local_18 = (BasicBlock *)CONCAT71((int7)((ulong)in_RAX >> 8),__from == (char *)0x0);
  if (__to != (char *)0x0 && __from != (char *)0x0) {
    iVar2._M_current = *(BasicBlock ***)(__from + 0x50);
    local_18 = (BasicBlock *)__from;
    from_local = (BasicBlock *)__to;
    if (iVar2._M_current == *(BasicBlock ***)(__from + 0x58)) {
      std::
      vector<wasm::CFGWalker<wasm::SpillPointers,wasm::Visitor<wasm::SpillPointers,void>,wasm::Liveness>::BasicBlock*,std::allocator<wasm::CFGWalker<wasm::SpillPointers,wasm::Visitor<wasm::SpillPointers,void>,wasm::Liveness>::BasicBlock*>>
      ::
      _M_realloc_insert<wasm::CFGWalker<wasm::SpillPointers,wasm::Visitor<wasm::SpillPointers,void>,wasm::Liveness>::BasicBlock*const&>
                ((vector<wasm::CFGWalker<wasm::SpillPointers,wasm::Visitor<wasm::SpillPointers,void>,wasm::Liveness>::BasicBlock*,std::allocator<wasm::CFGWalker<wasm::SpillPointers,wasm::Visitor<wasm::SpillPointers,void>,wasm::Liveness>::BasicBlock*>>
                  *)(__from + 0x48),iVar2,&from_local);
    }
    else {
      *iVar2._M_current = (BasicBlock *)__to;
      *(long *)(__from + 0x50) = *(long *)(__from + 0x50) + 8;
    }
    iVar2._M_current =
         (from_local->in).
         super__Vector_base<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (from_local->in).
        super__Vector_base<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<wasm::CFGWalker<wasm::SpillPointers,wasm::Visitor<wasm::SpillPointers,void>,wasm::Liveness>::BasicBlock*,std::allocator<wasm::CFGWalker<wasm::SpillPointers,wasm::Visitor<wasm::SpillPointers,void>,wasm::Liveness>::BasicBlock*>>
      ::
      _M_realloc_insert<wasm::CFGWalker<wasm::SpillPointers,wasm::Visitor<wasm::SpillPointers,void>,wasm::Liveness>::BasicBlock*const&>
                ((vector<wasm::CFGWalker<wasm::SpillPointers,wasm::Visitor<wasm::SpillPointers,void>,wasm::Liveness>::BasicBlock*,std::allocator<wasm::CFGWalker<wasm::SpillPointers,wasm::Visitor<wasm::SpillPointers,void>,wasm::Liveness>::BasicBlock*>>
                  *)&from_local->in,iVar2,&local_18);
      local_18 = extraout_RAX;
    }
    else {
      *iVar2._M_current = local_18;
      pppBVar1 = &(from_local->in).
                  super__Vector_base<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppBVar1 = *pppBVar1 + 1;
    }
  }
  return (int)local_18;
}

Assistant:

void link(BasicBlock* from, BasicBlock* to) {
    if (!from || !to) {
      return; // if one of them is not reachable, ignore
    }
    from->out.push_back(to);
    to->in.push_back(from);
  }